

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_keyt.c
# Opt level: O0

err_t bignKeyUnwrap(octet *key,bign_params *params,octet *token,size_t len,octet *header,
                   octet *privkey)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  word *c;
  word *key_00;
  word *in_RCX;
  word *in_RDX;
  void *in_RSI;
  void *in_RDI;
  word *in_R8;
  ec_o *in_R9;
  void *stack;
  octet *header2;
  octet *theta;
  word *t2;
  word *t1;
  word *R;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  size_t in_stack_ffffffffffffff68;
  word *src;
  octet c_00;
  bign_params *in_stack_ffffffffffffff70;
  u64 *dest;
  word *a;
  word *mod;
  word *b;
  word *a_00;
  bign_params *in_stack_ffffffffffffffa0;
  void *stack_00;
  bign_deep_i in_stack_ffffffffffffffb8;
  void *stack_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = bignIsOperable(in_stack_ffffffffffffff70);
  if (bVar1 == 0) {
    return 0x1f6;
  }
  bVar1 = memIsValid(in_RDX,(size_t)in_RCX);
  if ((bVar1 == 0) || ((in_R8 != (word *)0x0 && (bVar1 = memIsValid(in_R8,0x10), bVar1 == 0)))) {
    return 0x6d;
  }
  bignStart_keep(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
  c = (word *)blobCreate(in_stack_ffffffffffffff68);
  if (c == (word *)0x0) {
    return 0x6e;
  }
  eVar2 = bignStart(c,in_stack_ffffffffffffffa0);
  if (eVar2 != 0) {
    blobClose((blob_t)0x14e897);
    return eVar2;
  }
  stack_01 = *(void **)(c[3] + 0x38);
  stack_00 = *(void **)(c[3] + 0x30);
  if (in_RCX < (word *)((long)stack_01 + 0x20U)) {
    blobClose((blob_t)0x14e8f2);
    return 0x201;
  }
  bVar1 = memIsValid(in_R9,(size_t)stack_01);
  if ((bVar1 == 0) ||
     (bVar1 = memIsValid(in_RDI,(long)in_RCX + (-0x10 - (long)stack_01)), bVar1 == 0)) {
    blobClose((blob_t)0x14e940);
    return 0x6d;
  }
  key_00 = (word *)((long)c + *c);
  b = key_00 + (long)stack_00;
  mod = b + (long)stack_00 * 2;
  a = mod + (long)stack_00;
  dest = key_00 + 4;
  if ((ulong)((long)stack_01 * 5) < 0x30) {
    src = key_00 + 6;
  }
  else {
    src = a + (long)stack_00;
  }
  a_00 = key_00;
  u64From(dest,src,0x14ea03);
  bVar1 = wwIsZero(a_00,(size_t)stack_00);
  if ((bVar1 != 0) || (iVar3 = wwCmp(a_00,(word *)c[7],(size_t)stack_00), -1 < iVar3)) {
    blobClose((blob_t)0x14ea3e);
    return 0x1f8;
  }
  iVar3 = (**(code **)(c[3] + 0x40))(b,in_RDX,c[3],src);
  if (iVar3 == 0) {
    blobClose((blob_t)0x14ea83);
    return 0x201;
  }
  (**(code **)(c[3] + 0x70))(mod,b,c[3],src);
  zzAddMod(c,a_00,b,mod,(size_t)a);
  (**(code **)(c[3] + 0x68))(mod,mod,b,c[3],src);
  zzAddMod(c,a_00,b,mod,(size_t)a);
  wwCopy(b + (long)stack_00,*(word **)(c[3] + 0x18),(size_t)stack_00);
  zzAddW2(b + (long)stack_00,(size_t)stack_00,1);
  wwShLo(a,(size_t)key_00,(size_t)dest);
  qrPower(in_RDX,in_RCX,in_R8,(size_t)in_R9,(qr_o *)CONCAT44(eVar2,in_stack_ffffffffffffffc0),
          stack_01);
  (**(code **)(c[3] + 0x70))(a,b + (long)stack_00,c[3],src);
  bVar1 = wwEq(mod,a,(size_t)stack_00);
  if (bVar1 != 0) {
    bVar1 = ecMulA(in_RCX,in_R8,in_R9,(word *)CONCAT44(eVar2,in_stack_ffffffffffffffc0),
                   (size_t)stack_01,stack_00);
    if (bVar1 != 0) {
      (**(code **)(c[3] + 0x48))(key_00,b,c[3],src);
      memCopy(dest,src,0x14ecdf);
      memCopy(dest,src,0x14ecfc);
      c_00 = (octet)((ulong)src >> 0x38);
      beltWBLStart(a,(octet *)key_00,(size_t)dest);
      beltWBLStepD2(b,mod,(size_t)a,key_00);
      if (((in_R8 != (word *)0x0) && (bVar1 = memEq(in_R8,dest,0x10), bVar1 == 0)) ||
         ((in_R8 == (word *)0x0 && (bVar1 = memIsZero(dest,0x10), bVar1 == 0)))) {
        memSet(dest,c_00,0x14ed89);
        eVar2 = 0x201;
      }
      blobClose((blob_t)0x14ed9b);
      return eVar2;
    }
    blobClose((blob_t)0x14ec84);
    return 0x1f6;
  }
  blobClose((blob_t)0x14ec43);
  return 0x201;
}

Assistant:

err_t bignKeyUnwrap(octet key[], const bign_params* params, const octet token[], 
	size_t len, const octet header[16], const octet privkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* R;				/* [2n] точка R */
	word* t1;				/* [n] вспомогательное число */
	word* t2;				/* [n] вспомогательное число */
	octet* theta;			/* [32] ключ защиты */
	octet* header2;			/* [16] заголовок2 */
	void* stack;			/* граница стека */
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить token и header
	if (!memIsValid(token, len) ||
		!memIsNullOrValid(header, 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeyUnwrap_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить длину токена
	if (len < 32 + no)
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// проверить входные указатели
	if (!memIsValid(privkey, no) ||
		!memIsValid(key, len - 16 - no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	R = d + n;
	t1 = R + 2 * n;
	t2 = t1 + n;
	theta = (octet*)d;
	header2 = theta + 32;
	if (5 * no >= 48)
		stack = t2 + n;
	else
		stack = header2 + 16;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// xR <- x
	if (!qrFrom(R, token, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// t1 <- x^3 + a x + b
	qrSqr(t1, R, ec->f, stack);
	zmAdd(t1, t1, ec->A, ec->f);
	qrMul(t1, t1, R, ec->f, stack);
	zmAdd(t1, t1, ec->B, ec->f);
	// yR <- t1^{(p + 1) / 4}
	wwCopy(R + n, ec->f->mod, n);
	zzAddW2(R + n, n, 1);
	wwShLo(R + n, n, 2);
	qrPower(R + n, t1, R + n, n, ec->f, stack);
	// t2 <- yR^2
	qrSqr(t2, R + n, ec->f, stack);
	// (xR, yR) на кривой? t1 == t2?
	if (!wwEq(t1, t2, n))
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// R <- d R
	if (!ecMulA(R, R, ec, d, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// theta <- <R>_{256}
	qrTo(theta, ecX(R), ec->f, stack);
	// сформировать данные для расшифрования
	memCopy(key, token + no, len - no - 16);
	memCopy(header2, token + len - 16, 16);
	// расшифровать
	beltKWPStart(stack, theta, 32);
	beltKWPStepD2(key, header2, len - no, stack);
	// проверить целостность
	if (header && !memEq(header, header2, 16) ||
		header == 0 && !memIsZero(header2, 16))
	{
		memSetZero(key, len - no - 16);
		code = ERR_BAD_KEYTOKEN;
	}
	// завершение
	blobClose(state);
	return code;
}